

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UBool __thiscall
icu_63::Normalizer2Impl::composeUTF8
          (Normalizer2Impl *this,uint32_t options,UBool onlyContiguous,uint8_t *src,uint8_t *limit,
          ByteSink *sink,Edits *edits,UErrorCode *errorCode)

{
  byte *pbVar1;
  ushort *puVar2;
  ushort norm16;
  ushort norm16_00;
  UCPTrie *pUVar3;
  ushort uVar4;
  UBool UVar5;
  byte bVar6;
  UChar UVar7;
  uint uVar8;
  int32_t iVar9;
  int iVar10;
  UChar32 UVar11;
  uint uVar12;
  byte bVar13;
  int iVar14;
  uint newLength;
  uint uVar15;
  byte *pbVar16;
  byte *pbVar17;
  byte *limit_00;
  long lStackY_100;
  byte local_e9;
  byte *local_e8;
  byte local_d8;
  ReorderingBuffer buffer;
  UnicodeString s16;
  
  s16.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0024c170;
  s16.fUnion.fStackFields.fLengthAndFlags = 2;
  UVar7 = this->minCompNoMaybeCP;
  local_e8 = src;
  if (0x7f < (ushort)UVar7) {
    local_e9 = 0xe0;
    if (0x7ff < (ushort)UVar7) goto LAB_0017a83b;
    UVar7 = (UChar)(byte)((byte)((ushort)UVar7 >> 6) | 0xc0);
  }
  local_e9 = (byte)UVar7;
LAB_0017a83b:
  do {
    do {
      pbVar17 = src;
      if (pbVar17 == limit) {
        UVar5 = '\x01';
        if ((sink != (ByteSink *)0x0) && (local_e8 != limit)) {
          ByteSinkUtil::appendUnchanged(local_e8,limit,sink,options,edits,errorCode);
        }
        goto LAB_0017b2ba;
      }
      bVar6 = *pbVar17;
      uVar8 = (uint)bVar6;
      pbVar16 = pbVar17 + 1;
      src = pbVar16;
    } while (bVar6 < local_e9);
    limit_00 = pbVar16;
    if ((char)bVar6 < '\0') {
      if (pbVar16 != limit) {
        uVar8 = (uint)bVar6;
        if (bVar6 < 0xe0) {
          if ((0xc1 < bVar6) && ((byte)(*pbVar16 ^ 0x80) < 0x40)) {
            uVar8 = (uint)this->normTrie->index[uVar8 & 0x1f] + (*pbVar16 ^ 0x80);
LAB_0017a90b:
            limit_00 = limit_00 + 1;
            goto LAB_0017a99a;
          }
        }
        else if (bVar6 < 0xf0) {
          if (((((byte)" 000000000000\x1000"[uVar8 & 0xf] >> (*pbVar16 >> 5) & 1) != 0) &&
              (limit_00 = pbVar17 + 2, limit_00 != limit)) && ((byte)(*limit_00 ^ 0x80) < 0x40)) {
            uVar8 = (uint)*(ushort *)
                           ((long)this->normTrie->index +
                           (ulong)((uVar8 & 0xf) * 0x80 + (*pbVar16 & 0x3f) * 2)) +
                    (*limit_00 ^ 0x80);
            goto LAB_0017a90b;
          }
        }
        else if (bVar6 < 0xf5) {
          if ((((((uint)(int)""[*pbVar16 >> 4] >> (uVar8 - 0xf0 & 0x1f) & 1) != 0) &&
               (pbVar1 = pbVar17 + 2, limit_00 = pbVar1, pbVar1 != limit)) &&
              ((byte)(*pbVar1 + 0x80) < 0x40)) &&
             ((limit_00 = pbVar17 + 3, limit_00 != limit && ((byte)(*limit_00 + 0x80) < 0x40)))) {
            uVar8 = *pbVar16 & 0x3f | (uVar8 - 0xf0) * 0x40;
            pUVar3 = this->normTrie;
            if (uVar8 < pUVar3->shifted12HighStart) {
              uVar8 = ucptrie_internalSmallU8Index_63(pUVar3,uVar8,*pbVar1 + 0x80,*limit_00 + 0x80);
            }
            else {
              uVar8 = pUVar3->dataLength - 2;
            }
            goto LAB_0017a90b;
          }
        }
      }
      uVar8 = this->normTrie->dataLength - 1;
    }
LAB_0017a99a:
    norm16 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)(int)uVar8 * 2);
    src = limit_00;
  } while (norm16 < this->minNoNo);
  iVar10 = (int)limit_00;
  if (norm16 < this->minMaybeYes) {
    if (sink == (ByteSink *)0x0) goto LAB_0017b318;
    uVar8 = (uint)pbVar17;
    if (norm16 < this->limitNoNo) {
      if (norm16 < this->minNoNoCompBoundaryBefore) {
        UVar5 = norm16HasCompBoundaryAfter(this,norm16,onlyContiguous);
        if ((UVar5 == '\0') && (UVar5 = hasCompBoundaryBefore(this,limit_00,limit), UVar5 == '\0'))
        goto LAB_0017b053;
        if (((local_e8 != pbVar17) &&
            (UVar5 = ByteSinkUtil::appendUnchanged(local_e8,pbVar17,sink,options,edits,errorCode),
            UVar5 == '\0')) ||
           (puVar2 = (ushort *)((long)this->extraData + (ulong)(norm16 & 0xfffffffe)),
           UVar5 = ByteSinkUtil::appendChange
                             (pbVar17,limit_00,(char16_t *)(puVar2 + 1),*puVar2 & 0x1f,sink,edits,
                              errorCode), local_e8 = limit_00, UVar5 == '\0')) goto LAB_0017b2e5;
      }
      else {
        if ((norm16 < this->minNoNoEmpty) ||
           ((UVar5 = hasCompBoundaryBefore(this,limit_00,limit), UVar5 == '\0' &&
            (UVar5 = hasCompBoundaryAfter(this,local_e8,pbVar17,onlyContiguous), UVar5 == '\0'))))
        goto LAB_0017b053;
        if ((local_e8 != pbVar17) &&
           (UVar5 = ByteSinkUtil::appendUnchanged(local_e8,pbVar17,sink,options,edits,errorCode),
           UVar5 == '\0')) goto LAB_0017b2e5;
        local_e8 = limit_00;
        if (edits != (Edits *)0x0) {
          Edits::addReplace(edits,iVar10 - uVar8,0);
        }
      }
      goto LAB_0017a83b;
    }
    UVar5 = norm16HasCompBoundaryAfter(this,norm16,onlyContiguous);
    if ((UVar5 != '\0') || (UVar5 = hasCompBoundaryBefore(this,limit_00,limit), UVar5 != '\0')) {
      if ((local_e8 != pbVar17) &&
         (UVar5 = ByteSinkUtil::appendUnchanged(local_e8,pbVar17,sink,options,edits,errorCode),
         UVar5 == '\0')) goto LAB_0017b2e5;
      iVar14 = (uint)(norm16 >> 3) - (uint)this->centerNoNoDelta;
      if (iVar10 - uVar8 == 1) {
        newLength = 1;
        buffer.impl._0_1_ = (char)iVar14 + *pbVar17;
      }
      else {
        bVar6 = limit_00[-1];
        if (((uint)bVar6 + iVar14 & 0xffffffc0) == 0x80) {
          pbVar16 = pbVar17 + 1;
          if (pbVar17 + 1 < limit_00 + -1) {
            pbVar16 = limit_00 + -1;
          }
          memcpy(&buffer,pbVar17,(long)pbVar16 - (long)pbVar17);
          newLength = (int)pbVar16 + ~uVar8 + 2;
          *(char *)((long)&buffer.impl + ((long)pbVar16 - (long)pbVar17 & 0xffffffffU)) =
               (char)((uint)bVar6 + iVar14);
        }
        else {
          UVar11 = anon_unknown_16::codePointFromValidUTF8(pbVar17,limit_00);
          uVar12 = UVar11 + iVar14;
          if (uVar12 < 0x80) {
            newLength = 1;
            buffer.impl._0_1_ = (byte)uVar12;
          }
          else {
            if (uVar12 < 0x800) {
              buffer.impl._0_1_ = (byte)(uVar12 >> 6) | 0xc0;
              uVar15 = 1;
            }
            else {
              if (uVar12 < 0x10000) {
                buffer.impl._0_1_ = (byte)(uVar12 >> 0xc) | 0xe0;
                lStackY_100 = 1;
              }
              else {
                buffer.impl._0_1_ = (byte)(uVar12 >> 0x12) | 0xf0;
                buffer.impl._1_1_ = (byte)(uVar12 >> 0xc) & 0x3f | 0x80;
                lStackY_100 = 2;
              }
              uVar15 = (int)lStackY_100 + 1;
              *(byte *)((long)&buffer.impl + lStackY_100) = (byte)(uVar12 >> 6) & 0x3f | 0x80;
            }
            newLength = uVar15 + 1;
            *(byte *)((long)&buffer.impl + (ulong)uVar15) = (byte)uVar12 & 0x3f | 0x80;
          }
        }
      }
      if (edits != (Edits *)0x0) {
        Edits::addReplace(edits,iVar10 - uVar8,newLength);
      }
      (*sink->_vptr_ByteSink[2])(sink,&buffer,(ulong)newLength);
      local_e8 = limit_00;
      goto LAB_0017a83b;
    }
  }
  else if (norm16 == 0xfe00) {
    uVar8 = 0xffffffff;
    if (2 < (long)pbVar17 - (long)local_e8) {
      bVar6 = pbVar17[-3];
      uVar8 = 0xffffffff;
      if ((byte)(bVar6 + 0x1f) < 0xd) {
        uVar8 = 0xffffffff;
        bVar13 = (byte)(pbVar17[-2] ^ 0x80);
        if (bVar13 < 0x40) {
          uVar8 = 0xffffffff;
          if (((byte)(pbVar17[-1] ^ 0x80) < 0x40) &&
             ((bVar6 < 0xed || (uVar8 = 0xffffffff, bVar13 < 0x20)))) {
            uVar8 = (pbVar17[-2] ^ 0x80) << 6 | (bVar6 & 0xf) << 0xc | pbVar17[-1] ^ 0x80;
          }
        }
      }
    }
    if (*pbVar16 == 0x85) {
      if (0x12 < uVar8 - 0x1100) goto LAB_0017b053;
      if (sink == (ByteSink *)0x0) {
LAB_0017b318:
        UVar5 = '\0';
        goto LAB_0017b2ba;
      }
      iVar9 = anon_unknown_16::getJamoTMinusBase(limit_00,limit);
      if (iVar9 < 0) {
        UVar5 = hasCompBoundaryBefore(this,limit_00,limit);
        iVar10 = 0xac00;
        if (UVar5 == '\0') goto LAB_0017b053;
      }
      else {
        limit_00 = limit_00 + 3;
        iVar10 = iVar9 + 0xac00;
      }
      bVar6 = pbVar17[2];
      pbVar17 = pbVar17 + -3;
      if ((local_e8 != pbVar17) &&
         (UVar5 = ByteSinkUtil::appendUnchanged(local_e8,pbVar17,sink,options,edits,errorCode),
         UVar5 == '\0')) goto LAB_0017b2e5;
      ByteSinkUtil::appendCodePoint
                ((int)limit_00 - (int)pbVar17,
                 ((uVar8 - 0x1100) * 0x15 + (uint)bVar6) * 0x1c + iVar10 + -0x119c,sink,edits);
      src = limit_00;
      local_e8 = limit_00;
      goto LAB_0017a83b;
    }
    if ((uVar8 - 0xac00 < 0x2ba4) && ((short)((uVar8 - 0xac00 & 0xffff) % 0x1c) == 0)) {
      if (sink == (ByteSink *)0x0) goto LAB_0017b318;
      iVar9 = anon_unknown_16::getJamoTMinusBase(pbVar17,limit_00);
      pbVar17 = pbVar17 + -3;
      if ((local_e8 != pbVar17) &&
         (UVar5 = ByteSinkUtil::appendUnchanged(local_e8,pbVar17,sink,options,edits,errorCode),
         UVar5 == '\0')) goto LAB_0017b2e5;
      ByteSinkUtil::appendCodePoint(iVar10 - (int)pbVar17,iVar9 + uVar8,sink,edits);
      local_e8 = limit_00;
      goto LAB_0017a83b;
    }
  }
  else if (0xfe00 < norm16) {
    uVar4 = norm16 >> 1;
    if (onlyContiguous != '\0') {
      bVar6 = getPreviousTrailCC(this,local_e8,pbVar17);
      local_d8 = (byte)uVar4;
      if (local_d8 < bVar6) {
        if (sink == (ByteSink *)0x0) goto LAB_0017b318;
        goto LAB_0017b053;
      }
    }
    do {
      limit_00 = src;
      if (limit_00 == limit) {
        UVar5 = '\x01';
        if (sink != (ByteSink *)0x0) {
          ByteSinkUtil::appendUnchanged(local_e8,limit,sink,options,edits,errorCode);
        }
        goto LAB_0017b2ba;
      }
      src = limit_00 + 1;
      bVar6 = *limit_00;
      uVar8 = (uint)bVar6;
      if ((char)bVar6 < '\0') {
        if (src != limit) {
          uVar8 = (uint)bVar6;
          if (bVar6 < 0xe0) {
            if ((0xc1 < bVar6) && ((byte)(*src ^ 0x80) < 0x40)) {
              uVar8 = (uint)this->normTrie->index[uVar8 & 0x1f] + (*src ^ 0x80);
LAB_0017ac65:
              src = src + 1;
              goto LAB_0017ace3;
            }
          }
          else if (bVar6 < 0xf0) {
            bVar6 = *src;
            if (((((byte)" 000000000000\x1000"[uVar8 & 0xf] >> (bVar6 >> 5) & 1) != 0) &&
                (src = limit_00 + 2, src != limit)) && ((byte)(*src ^ 0x80) < 0x40)) {
              uVar8 = (uint)*(ushort *)
                             ((long)this->normTrie->index +
                             (ulong)((uVar8 & 0xf) * 0x80 + (bVar6 & 0x3f) * 2)) + (*src ^ 0x80);
              goto LAB_0017ac65;
            }
          }
          else if (bVar6 < 0xf5) {
            bVar6 = *src;
            if ((((((uint)(int)""[bVar6 >> 4] >> (uVar8 - 0xf0 & 0x1f) & 1) != 0) &&
                 (src = limit_00 + 2, src != limit)) &&
                (bVar13 = *src, (byte)(bVar13 + 0x80) < 0x40)) &&
               ((src = limit_00 + 3, src != limit && ((byte)(*src + 0x80) < 0x40)))) {
              uVar8 = bVar6 & 0x3f | (uVar8 - 0xf0) * 0x40;
              pUVar3 = this->normTrie;
              if (uVar8 < pUVar3->shifted12HighStart) {
                uVar8 = ucptrie_internalSmallU8Index_63(pUVar3,uVar8,bVar13 + 0x80,*src + 0x80);
              }
              else {
                uVar8 = pUVar3->dataLength - 2;
              }
              goto LAB_0017ac65;
            }
          }
        }
        uVar8 = this->normTrie->dataLength - 1;
      }
LAB_0017ace3:
      norm16_00 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)(int)uVar8 * 2);
      if (norm16_00 < 0xfe02) goto LAB_0017af70;
      local_d8 = (byte)uVar4;
      uVar4 = norm16_00 >> 1;
    } while (local_d8 <= (byte)(norm16_00 >> 1));
    if (sink == (ByteSink *)0x0) goto LAB_0017b318;
LAB_0017af70:
    UVar5 = norm16HasCompBoundaryBefore(this,norm16_00);
    if (UVar5 != '\0') {
      if (this->minNoNo <= norm16_00) {
        src = limit_00;
      }
      goto LAB_0017a83b;
    }
  }
LAB_0017b053:
  if ((local_e8 != pbVar17) && (UVar5 = norm16HasCompBoundaryBefore(this,norm16), UVar5 == '\0')) {
    pbVar16 = pbVar17 + -1;
    bVar6 = pbVar17[-1];
    uVar8 = (uint)bVar6;
    if ((char)bVar6 < '\0') {
      uVar8 = ucptrie_internalU8PrevIndex_63(this->normTrie,(uint)bVar6,local_e8,pbVar16);
      pbVar16 = pbVar16 + -(ulong)(uVar8 & 7);
      uVar8 = (int)uVar8 >> 3;
    }
    UVar5 = norm16HasCompBoundaryAfter
                      (this,*(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)(int)uVar8 * 2),
                       onlyContiguous);
    if (UVar5 == '\0') {
      pbVar17 = pbVar16;
    }
  }
  ReorderingBuffer::ReorderingBuffer(&buffer,this,&s16,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    decomposeShort(this,pbVar17,limit_00,'\0',onlyContiguous,&buffer,errorCode);
    src = decomposeShort(this,limit_00,limit,'\x01',onlyContiguous,&buffer,errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if (0x7fffffff < (long)src - (long)pbVar17) {
        *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        UVar5 = '\x01';
LAB_0017b330:
        ReorderingBuffer::~ReorderingBuffer(&buffer);
        goto LAB_0017b2ba;
      }
      recompose(this,&buffer,0,onlyContiguous);
      UVar5 = ReorderingBuffer::equals(&buffer,pbVar17,src);
      if (UVar5 == '\0') {
        if (sink == (ByteSink *)0x0) {
          UVar5 = '\0';
          goto LAB_0017b330;
        }
        if (((local_e8 != pbVar17) &&
            (UVar5 = ByteSinkUtil::appendUnchanged(local_e8,pbVar17,sink,options,edits,errorCode),
            UVar5 == '\0')) ||
           (UVar5 = ByteSinkUtil::appendChange
                              (pbVar17,src,buffer.start,
                               (int32_t)((ulong)((long)buffer.limit - (long)buffer.start) >> 1),sink
                               ,edits,errorCode), local_e8 = src, UVar5 == '\0')) goto LAB_0017b2db;
      }
      ReorderingBuffer::~ReorderingBuffer(&buffer);
      goto LAB_0017a83b;
    }
  }
LAB_0017b2db:
  ReorderingBuffer::~ReorderingBuffer(&buffer);
LAB_0017b2e5:
  UVar5 = '\x01';
LAB_0017b2ba:
  UnicodeString::~UnicodeString(&s16);
  return UVar5;
}

Assistant:

UBool
Normalizer2Impl::composeUTF8(uint32_t options, UBool onlyContiguous,
                             const uint8_t *src, const uint8_t *limit,
                             ByteSink *sink, Edits *edits, UErrorCode &errorCode) const {
    U_ASSERT(limit != nullptr);
    UnicodeString s16;
    uint8_t minNoMaybeLead = leadByteForCP(minCompNoMaybeCP);
    const uint8_t *prevBoundary = src;

    for (;;) {
        // Fast path: Scan over a sequence of characters below the minimum "no or maybe" code point,
        // or with (compYes && ccc==0) properties.
        const uint8_t *prevSrc;
        uint16_t norm16 = 0;
        for (;;) {
            if (src == limit) {
                if (prevBoundary != limit && sink != nullptr) {
                    ByteSinkUtil::appendUnchanged(prevBoundary, limit,
                                                  *sink, options, edits, errorCode);
                }
                return TRUE;
            }
            if (*src < minNoMaybeLead) {
                ++src;
            } else {
                prevSrc = src;
                UCPTRIE_FAST_U8_NEXT(normTrie, UCPTRIE_16, src, limit, norm16);
                if (!isCompYesAndZeroCC(norm16)) {
                    break;
                }
            }
        }
        // isCompYesAndZeroCC(norm16) is false, that is, norm16>=minNoNo.
        // The current character is either a "noNo" (has a mapping)
        // or a "maybeYes" (combines backward)
        // or a "yesYes" with ccc!=0.
        // It is not a Hangul syllable or Jamo L because those have "yes" properties.

        // Medium-fast path: Handle cases that do not require full decomposition and recomposition.
        if (!isMaybeOrNonZeroCC(norm16)) {  // minNoNo <= norm16 < minMaybeYes
            if (sink == nullptr) {
                return FALSE;
            }
            // Fast path for mapping a character that is immediately surrounded by boundaries.
            // In this case, we need not decompose around the current character.
            if (isDecompNoAlgorithmic(norm16)) {
                // Maps to a single isCompYesAndZeroCC character
                // which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc &&
                            !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                           *sink, options, edits, errorCode)) {
                        break;
                    }
                    appendCodePointDelta(prevSrc, src, getAlgorithmicDelta(norm16), *sink, edits);
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 < minNoNoCompBoundaryBefore) {
                // The mapping is comp-normalized which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc &&
                            !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                           *sink, options, edits, errorCode)) {
                        break;
                    }
                    const uint16_t *mapping = getMapping(norm16);
                    int32_t length = *mapping++ & MAPPING_LENGTH_MASK;
                    if (!ByteSinkUtil::appendChange(prevSrc, src, (const UChar *)mapping, length,
                                                    *sink, edits, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 >= minNoNoEmpty) {
                // The current character maps to nothing.
                // Simply omit it from the output if there is a boundary before _or_ after it.
                // The character itself implies no boundaries.
                if (hasCompBoundaryBefore(src, limit) ||
                        hasCompBoundaryAfter(prevBoundary, prevSrc, onlyContiguous)) {
                    if (prevBoundary != prevSrc &&
                            !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                           *sink, options, edits, errorCode)) {
                        break;
                    }
                    if (edits != nullptr) {
                        edits->addReplace((int32_t)(src - prevSrc), 0);
                    }
                    prevBoundary = src;
                    continue;
                }
            }
            // Other "noNo" type, or need to examine more text around this character:
            // Fall through to the slow path.
        } else if (isJamoVT(norm16)) {
            // Jamo L: E1 84 80..92
            // Jamo V: E1 85 A1..B5
            // Jamo T: E1 86 A8..E1 87 82
            U_ASSERT((src - prevSrc) == 3 && *prevSrc == 0xe1);
            UChar32 prev = previousHangulOrJamo(prevBoundary, prevSrc);
            if (prevSrc[1] == 0x85) {
                // The current character is a Jamo Vowel,
                // compose with previous Jamo L and following Jamo T.
                UChar32 l = prev - Hangul::JAMO_L_BASE;
                if ((uint32_t)l < Hangul::JAMO_L_COUNT) {
                    if (sink == nullptr) {
                        return FALSE;
                    }
                    int32_t t = getJamoTMinusBase(src, limit);
                    if (t >= 0) {
                        // The next character is a Jamo T.
                        src += 3;
                    } else if (hasCompBoundaryBefore(src, limit)) {
                        // No Jamo T follows, not even via decomposition.
                        t = 0;
                    }
                    if (t >= 0) {
                        UChar32 syllable = Hangul::HANGUL_BASE +
                            (l*Hangul::JAMO_V_COUNT + (prevSrc[2]-0xa1)) *
                            Hangul::JAMO_T_COUNT + t;
                        prevSrc -= 3;  // Replace the Jamo L as well.
                        if (prevBoundary != prevSrc &&
                                !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                               *sink, options, edits, errorCode)) {
                            break;
                        }
                        ByteSinkUtil::appendCodePoint(prevSrc, src, syllable, *sink, edits);
                        prevBoundary = src;
                        continue;
                    }
                    // If we see L+V+x where x!=T then we drop to the slow path,
                    // decompose and recompose.
                    // This is to deal with NFKC finding normal L and V but a
                    // compatibility variant of a T.
                    // We need to either fully compose that combination here
                    // (which would complicate the code and may not work with strange custom data)
                    // or use the slow path.
                }
            } else if (Hangul::isHangulLV(prev)) {
                // The current character is a Jamo Trailing consonant,
                // compose with previous Hangul LV that does not contain a Jamo T.
                if (sink == nullptr) {
                    return FALSE;
                }
                UChar32 syllable = prev + getJamoTMinusBase(prevSrc, src);
                prevSrc -= 3;  // Replace the Hangul LV as well.
                if (prevBoundary != prevSrc &&
                        !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                       *sink, options, edits, errorCode)) {
                    break;
                }
                ByteSinkUtil::appendCodePoint(prevSrc, src, syllable, *sink, edits);
                prevBoundary = src;
                continue;
            }
            // No matching context, or may need to decompose surrounding text first:
            // Fall through to the slow path.
        } else if (norm16 > JAMO_VT) {  // norm16 >= MIN_YES_YES_WITH_CC
            // One or more combining marks that do not combine-back:
            // Check for canonical order, copy unchanged if ok and
            // if followed by a character with a boundary-before.
            uint8_t cc = getCCFromNormalYesOrMaybe(norm16);  // cc!=0
            if (onlyContiguous /* FCC */ && getPreviousTrailCC(prevBoundary, prevSrc) > cc) {
                // Fails FCD test, need to decompose and contiguously recompose.
                if (sink == nullptr) {
                    return FALSE;
                }
            } else {
                // If !onlyContiguous (not FCC), then we ignore the tccc of
                // the previous character which passed the quick check "yes && ccc==0" test.
                const uint8_t *nextSrc;
                uint16_t n16;
                for (;;) {
                    if (src == limit) {
                        if (sink != nullptr) {
                            ByteSinkUtil::appendUnchanged(prevBoundary, limit,
                                                          *sink, options, edits, errorCode);
                        }
                        return TRUE;
                    }
                    uint8_t prevCC = cc;
                    nextSrc = src;
                    UCPTRIE_FAST_U8_NEXT(normTrie, UCPTRIE_16, nextSrc, limit, n16);
                    if (n16 >= MIN_YES_YES_WITH_CC) {
                        cc = getCCFromNormalYesOrMaybe(n16);
                        if (prevCC > cc) {
                            if (sink == nullptr) {
                                return FALSE;
                            }
                            break;
                        }
                    } else {
                        break;
                    }
                    src = nextSrc;
                }
                // src is after the last in-order combining mark.
                // If there is a boundary here, then we continue with no change.
                if (norm16HasCompBoundaryBefore(n16)) {
                    if (isCompYesAndZeroCC(n16)) {
                        src = nextSrc;
                    }
                    continue;
                }
                // Use the slow path. There is no boundary in [prevSrc, src[.
            }
        }

        // Slow path: Find the nearest boundaries around the current character,
        // decompose and recompose.
        if (prevBoundary != prevSrc && !norm16HasCompBoundaryBefore(norm16)) {
            const uint8_t *p = prevSrc;
            UCPTRIE_FAST_U8_PREV(normTrie, UCPTRIE_16, prevBoundary, p, norm16);
            if (!norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
                prevSrc = p;
            }
        }
        ReorderingBuffer buffer(*this, s16, errorCode);
        if (U_FAILURE(errorCode)) {
            break;
        }
        // We know there is not a boundary here.
        decomposeShort(prevSrc, src, FALSE /* !stopAtCompBoundary */, onlyContiguous,
                       buffer, errorCode);
        // Decompose until the next boundary.
        src = decomposeShort(src, limit, TRUE /* stopAtCompBoundary */, onlyContiguous,
                             buffer, errorCode);
        if (U_FAILURE(errorCode)) {
            break;
        }
        if ((src - prevSrc) > INT32_MAX) {  // guard before buffer.equals()
            errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            return TRUE;
        }
        recompose(buffer, 0, onlyContiguous);
        if (!buffer.equals(prevSrc, src)) {
            if (sink == nullptr) {
                return FALSE;
            }
            if (prevBoundary != prevSrc &&
                    !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                   *sink, options, edits, errorCode)) {
                break;
            }
            if (!ByteSinkUtil::appendChange(prevSrc, src, buffer.getStart(), buffer.length(),
                                            *sink, edits, errorCode)) {
                break;
            }
            prevBoundary = src;
        }
    }
    return TRUE;
}